

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_working_path.c
# Opt level: O1

int portability_working_path(char *path,portability_working_path_length *length)

{
  char *pcVar1;
  size_t sVar2;
  
  memset(path,0,0x1000);
  pcVar1 = getcwd(path,0x1000);
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strnlen(path,0x1000);
  }
  *length = sVar2;
  return (uint)(pcVar1 == (char *)0x0);
}

Assistant:

int portability_working_path(portability_working_path_str path, portability_working_path_length *length)
{
	const portability_working_path_length path_max_length = PORTABILITY_PATH_SIZE;

	/* Reset the path */
	memset(path, 0, path_max_length);

#if defined(WIN32) || defined(_WIN32) || \
	defined(__CYGWIN__) || defined(__CYGWIN32__) || \
	defined(__MINGW32__) || defined(__MINGW64__)
	*length = GetCurrentDirectory(0, NULL);

	if (*length == 0)
	{
		/* TODO: DWORD dw = GetLastError(); */
		return 1;
	}

	if (*length > path_max_length)
	{
		/* TODO: Handle error */
		return 1;
	}

	if (GetCurrentDirectory(*length, path) == 0)
	{
		/* TODO: DWORD dw = GetLastError(); */
		return 1;
	}
#else
	if (getcwd(path, path_max_length) == NULL)
	{
		*length = 0;
		/* TODO: Handle error */
		return 1;
	}

	*length = strnlen(path, path_max_length);
#endif

	return 0;
}